

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O0

ibuf * ibuf_dynamic(size_t len,size_t max)

{
  ulong in_RSI;
  ulong in_RDI;
  ibuf *buf;
  size_t in_stack_ffffffffffffffd8;
  ibuf *local_8;
  
  if (in_RSI < in_RDI) {
    local_8 = (ibuf *)0x0;
  }
  else {
    local_8 = ibuf_open(in_stack_ffffffffffffffd8);
    if (local_8 == (ibuf *)0x0) {
      local_8 = (ibuf *)0x0;
    }
    else if (in_RSI != 0) {
      local_8->max = in_RSI;
    }
  }
  return local_8;
}

Assistant:

struct ibuf *
ibuf_dynamic(size_t len, size_t max)
{
	struct ibuf	*buf;

	if (max < len)
		return (NULL);

	if ((buf = ibuf_open(len)) == NULL)
		return (NULL);

	if (max > 0)
		buf->max = max;

	return (buf);
}